

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_undo(nk_text_edit *state)

{
  nk_rune *dst0;
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  long lVar5;
  short *psVar6;
  int len_00;
  short sVar7;
  int len_01;
  int iVar8;
  uint pos;
  int len;
  nk_rune local_5c;
  short *local_58;
  int local_4c;
  ulong local_48;
  long local_40;
  int local_34;
  
  lVar4 = (long)(state->undo).undo_point;
  if (lVar4 != 0) {
    pos = (state->undo).undo_rec[lVar4 + -1].where;
    sVar7 = (state->undo).undo_rec[lVar4 + -1].insert_length;
    len_01 = (int)sVar7;
    sVar1 = (state->undo).undo_rec[lVar4 + -1].delete_length;
    len_00 = (int)sVar1;
    lVar4 = (long)(state->undo).undo_rec[lVar4 + -1].char_storage;
    lVar5 = (long)(state->undo).redo_point;
    (state->undo).undo_rec[lVar5 + -1].char_storage = -1;
    (state->undo).undo_rec[lVar5 + -1].insert_length = sVar1;
    (state->undo).undo_rec[lVar5 + -1].delete_length = sVar7;
    (state->undo).undo_rec[lVar5 + -1].where = pos;
    if (sVar1 != 0) {
      if ((state->undo).undo_char_point + len_00 < 999) {
        local_58 = &(state->undo).undo_rec[0].char_storage;
        local_4c = len_01;
        local_48 = (ulong)pos;
        local_40 = lVar4;
        do {
          iVar8 = (state->undo).undo_char_point + len_00;
          sVar7 = (state->undo).redo_char_point;
          if (iVar8 <= sVar7) {
            lVar4 = (long)(state->undo).redo_point;
            (state->undo).undo_rec[lVar4 + -1].char_storage = sVar7 - sVar1;
            (state->undo).redo_char_point = sVar7 - sVar1;
            if (0 < sVar1) {
              local_58 = &(state->undo).undo_rec[lVar4 + -1].char_storage;
              lVar4 = 0;
              do {
                local_5c = 0;
                nk_str_at_const(&state->string,(int)local_48 + (int)lVar4,&local_5c,&local_34);
                (state->undo).undo_char[*local_58 + lVar4] = local_5c;
                lVar4 = lVar4 + 1;
              } while (len_00 != (int)lVar4);
            }
            break;
          }
          if ((state->undo).redo_point < 99) {
            if (-1 < (state->undo).undo_rec[0x62].char_storage) {
              sVar3 = (state->undo).undo_rec[0x62].insert_length;
              sVar2 = (state->undo).redo_char_point + sVar3;
              (state->undo).redo_char_point = sVar2;
              dst0 = (state->undo).undo_char + sVar2;
              nk_memcopy(dst0,dst0 + -(long)sVar3,999 - (long)sVar2);
              lVar4 = (long)(state->undo).redo_point;
              if (lVar4 < 0x62) {
                lVar5 = lVar4 + -0x62;
                psVar6 = local_58 + lVar4 * 6;
                do {
                  if (-1 < *psVar6) {
                    *psVar6 = *psVar6 + sVar3;
                  }
                  psVar6 = psVar6 + 6;
                  lVar5 = lVar5 + 1;
                } while (lVar5 != 0);
              }
            }
            sVar3 = (state->undo).redo_point + 1;
            (state->undo).redo_point = sVar3;
            if (sVar3 != 99) {
              lVar4 = (long)sVar3;
              nk_memcopy((state->undo).undo_rec + lVar4 + -1,(state->undo).undo_rec + lVar4,
                         (99 - lVar4) * 0xc);
            }
          }
        } while ((state->undo).redo_point != 99);
        pos = (uint)local_48;
        lVar4 = local_40;
        len_01 = local_4c;
        if (sVar7 < iVar8) {
          return;
        }
      }
      else {
        (state->undo).undo_rec[lVar5 + -1].insert_length = 0;
      }
      nk_str_delete_runes(&state->string,pos,len_00);
    }
    sVar7 = (short)len_01;
    if (sVar7 != 0) {
      nk_str_insert_text_runes(&state->string,pos,(state->undo).undo_char + lVar4,len_01);
      psVar6 = &(state->undo).undo_char_point;
      *psVar6 = *psVar6 - sVar7;
    }
    state->cursor = (int)(short)(sVar7 + (short)pos);
    psVar6 = &(state->undo).undo_point;
    *psVar6 = *psVar6 + -1;
    psVar6 = &(state->undo).redo_point;
    *psVar6 = *psVar6 + -1;
  }
  return;
}

Assistant:

NK_API void
nk_textedit_undo(struct nk_text_edit *state)
{
    struct nk_text_undo_state *s = &state->undo;
    struct nk_text_undo_record u, *r;
    if (s->undo_point == 0)
        return;

    /* we need to do two things: apply the undo record, and create a redo record */
    u = s->undo_rec[s->undo_point-1];
    r = &s->undo_rec[s->redo_point-1];
    r->char_storage = -1;

    r->insert_length = u.delete_length;
    r->delete_length = u.insert_length;
    r->where = u.where;

    if (u.delete_length)
    {
       /*   if the undo record says to delete characters, then the redo record will
            need to re-insert the characters that get deleted, so we need to store
            them.
            there are three cases:
                - there's enough room to store the characters
                - characters stored for *redoing* don't leave room for redo
                - characters stored for *undoing* don't leave room for redo
            if the last is true, we have to bail */
        if (s->undo_char_point + u.delete_length >= NK_TEXTEDIT_UNDOCHARCOUNT) {
            /* the undo records take up too much character space; there's no space
            * to store the redo characters */
            r->insert_length = 0;
        } else {
            int i;
            /* there's definitely room to store the characters eventually */
            while (s->undo_char_point + u.delete_length > s->redo_char_point) {
                /* there's currently not enough room, so discard a redo record */
                nk_textedit_discard_redo(s);
                /* should never happen: */
                if (s->redo_point == NK_TEXTEDIT_UNDOSTATECOUNT)
                    return;
            }

            r = &s->undo_rec[s->redo_point-1];
            r->char_storage = (short)(s->redo_char_point - u.delete_length);
            s->redo_char_point = (short)(s->redo_char_point -  u.delete_length);

            /* now save the characters */
            for (i=0; i < u.delete_length; ++i)
                s->undo_char[r->char_storage + i] =
                    nk_str_rune_at(&state->string, u.where + i);
        }
        /* now we can carry out the deletion */
        nk_str_delete_runes(&state->string, u.where, u.delete_length);
    }

    /* check type of recorded action: */
    if (u.insert_length) {
        /* easy case: was a deletion, so we need to insert n characters */
        nk_str_insert_text_runes(&state->string, u.where,
            &s->undo_char[u.char_storage], u.insert_length);
        s->undo_char_point = (short)(s->undo_char_point - u.insert_length);
    }
    state->cursor = (short)(u.where + u.insert_length);

    s->undo_point--;
    s->redo_point--;
}